

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverageFuncs.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::CoverageNameOrHierFunc::checkArguments
          (CoverageNameOrHierFunc *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  SymbolKind SVar1;
  Compilation *pCVar2;
  Expression *pEVar3;
  InstanceSymbol *this_00;
  bool bVar4;
  Type *this_01;
  Type *pTVar5;
  Diagnostic *pDVar6;
  Type **ppTVar7;
  string_view arg;
  
  pCVar2 = ((context->scope).ptr)->compilation;
  bVar4 = SystemSubroutine::checkArgCount
                    (&this->super_SystemSubroutine,context,false,args,range,this->requiredArgs,
                     (long)(this->argTypes).
                           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->argTypes).
                           super__Vector_base<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (bVar4) {
    pEVar3 = args->_M_ptr[this->nameOrHierIndex];
    if (pEVar3->kind == ArbitrarySymbol) {
      this_00 = *(InstanceSymbol **)(pEVar3 + 1);
      bVar4 = Symbol::isValue((Symbol *)this_00);
      if (bVar4) {
        this_01 = DeclaredType::getType
                            ((DeclaredType *)&(this_00->super_InstanceSymbolBase).arrayPath);
        pTVar5 = this_01->canonical;
        if (pTVar5 == (Type *)0x0) {
          Type::resolveCanonical(this_01);
          pTVar5 = this_01->canonical;
        }
        if ((pTVar5->super_Symbol).kind != StringType) {
          pDVar6 = ASTContext::addDiag(context,(DiagCode)0x5000b,pEVar3->sourceRange);
          pDVar6 = ast::operator<<(pDVar6,this_01);
          arg = SystemSubroutine::kindStr(&this->super_SystemSubroutine);
          Diagnostic::operator<<(pDVar6,arg);
          goto LAB_0046a6e6;
        }
      }
      else {
        SVar1 = (this_00->super_InstanceSymbolBase).super_Symbol.kind;
        if (SVar1 != Root) {
          if (SVar1 == Instance) {
            bVar4 = InstanceSymbol::isModule(this_00);
            if (bVar4) goto LAB_0046a6bf;
          }
          bVar4 = Scope::isUninstantiated((context->scope).ptr);
          if (!bVar4) {
            ASTContext::addDiag(context,(DiagCode)0xa000b,pEVar3->sourceRange);
          }
          goto LAB_0046a6e6;
        }
      }
    }
LAB_0046a6bf:
    ppTVar7 = &this->returnType;
  }
  else {
LAB_0046a6e6:
    ppTVar7 = &pCVar2->errorType;
  }
  return *ppTVar7;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, requiredArgs, argTypes.size()))
            return comp.getErrorType();

        auto arg = args[nameOrHierIndex];
        if (arg->kind == ExpressionKind::ArbitrarySymbol) {
            auto& sym = *arg->as<ArbitrarySymbolExpression>().symbol;
            if (sym.isValue()) {
                auto& type = sym.as<ValueSymbol>().getType();
                if (!type.isString()) {
                    context.addDiag(diag::BadSystemSubroutineArg, arg->sourceRange)
                        << type << kindStr();
                    return comp.getErrorType();
                }
            }
            else if (sym.kind != SymbolKind::Root &&
                     (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule())) {
                if (!context.scope->isUninstantiated())
                    context.addDiag(diag::ExpectedModuleInstance, arg->sourceRange);
                return comp.getErrorType();
            }
        }

        return *returnType;
    }